

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O2

aiMaterial * __thiscall Assimp::SkeletonMeshBuilder::CreateMaterial(SkeletonMeshBuilder *this)

{
  aiMaterial *this_00;
  size_t __n;
  allocator<char> local_441;
  int no_cull;
  undefined4 uStack_43c;
  ulong local_438;
  aiString matName;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&no_cull,"SkeletonMaterial",&local_441);
  __n = 0x3ff;
  if ((local_438 & 0xfffffc00) == 0) {
    __n = local_438 & 0xffffffff;
  }
  matName.length = (ai_uint32)__n;
  memcpy(matName.data,(void *)CONCAT44(uStack_43c,no_cull),__n);
  matName.data[__n] = '\0';
  std::__cxx11::string::~string((string *)&no_cull);
  aiMaterial::AddProperty(this_00,&matName,"?mat.name",0,0);
  no_cull = 1;
  aiMaterial::AddProperty(this_00,&no_cull,1,"$mat.twosided",0,0);
  return this_00;
}

Assistant:

aiMaterial* SkeletonMeshBuilder::CreateMaterial()
{
    aiMaterial* matHelper = new aiMaterial;

    // Name
    aiString matName( std::string( "SkeletonMaterial"));
    matHelper->AddProperty( &matName, AI_MATKEY_NAME);

    // Prevent backface culling
    const int no_cull = 1;
    matHelper->AddProperty(&no_cull,1,AI_MATKEY_TWOSIDED);

    return matHelper;
}